

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

pair<trieste::NodeDef_*,_trieste::NodeDef_*> __thiscall
trieste::NodeDef::same_parent(NodeDef *this,NodeDef *q)

{
  int iVar1;
  int iVar2;
  NodeDef *t;
  NodeDef *pNVar3;
  NodeDef *pNVar4;
  NodeDef *p;
  bool bVar5;
  pair<trieste::NodeDef_*,_trieste::NodeDef_*> pVar6;
  
  iVar1 = 0;
  for (pNVar3 = this; pNVar4 = q, pNVar3 != (NodeDef *)0x0; pNVar3 = pNVar3->parent_) {
    iVar1 = iVar1 + -1;
  }
  for (; pNVar4 != (NodeDef *)0x0; pNVar4 = pNVar4->parent_) {
    iVar1 = iVar1 + 1;
  }
  iVar2 = 0;
  if (iVar1 < 0) {
    iVar2 = -iVar1;
  }
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    this = this->parent_;
  }
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    q = q->parent_;
  }
  do {
    pNVar4 = this;
    pNVar3 = q;
    this = pNVar4->parent_;
    q = pNVar3->parent_;
  } while (this != q);
  pVar6.second = pNVar3;
  pVar6.first = pNVar4;
  return pVar6;
}

Assistant:

std::pair<NodeDef*, NodeDef*> same_parent(NodeDef* q)
    {
      auto p = this;

      // Adjust p and q to point to the same depth in the AST.
      int d1 = 0, d2 = 0;

      for (auto t = p; t; t = t->parent_)
        ++d1;
      for (auto t = q; t; t = t->parent_)
        ++d2;

      for (int i = 0; i < (d1 - d2); ++i)
        p = p->parent_;
      for (int i = 0; i < (d2 - d1); ++i)
        q = q->parent_;

      // Find the common parent.
      while (p->parent_ != q->parent_)
      {
        p = p->parent_;
        q = q->parent_;
      }

      return {p, q};
    }